

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O1

bool __thiscall draco::ObjDecoder::ParseDefinition(ObjDecoder *this,Status *status)

{
  long lVar1;
  DecoderBuffer *buffer;
  long lVar2;
  long lVar3;
  bool bVar4;
  Status *pSVar5;
  
  buffer = &this->buffer_;
  parser::SkipWhitespace(buffer);
  lVar2 = (this->buffer_).data_size_;
  lVar3 = (this->buffer_).pos_;
  lVar1 = lVar3 + 1;
  if ((lVar1 <= lVar2) &&
     ((buffer->data_[lVar3] == '#' ||
      ((((bVar4 = ParseVertexPosition(this,status), !bVar4 &&
         (bVar4 = ParseNormal(this,status), !bVar4)) && (bVar4 = ParseTexCoord(this,status), !bVar4)
        ) && (((pSVar5 = status, bVar4 = ParseFace(this,status), !bVar4 &&
               (bVar4 = ParseMaterial(this,pSVar5), !bVar4)) &&
              ((bVar4 = ParseMaterialLib(this,status), !bVar4 &&
               (bVar4 = ParseObject(this,status), !bVar4)))))))))) {
    parser::SkipLine(buffer);
  }
  return lVar1 <= lVar2;
}

Assistant:

bool ObjDecoder::ParseDefinition(Status *status) {
  char c;
  parser::SkipWhitespace(buffer());
  if (!buffer()->Peek(&c)) {
    // End of file reached?.
    return false;
  }
  if (c == '#') {
    // Comment, ignore the line.
    parser::SkipLine(buffer());
    return true;
  }
  if (ParseVertexPosition(status)) {
    return true;
  }
  if (ParseNormal(status)) {
    return true;
  }
  if (ParseTexCoord(status)) {
    return true;
  }
  if (ParseFace(status)) {
    return true;
  }
  if (ParseMaterial(status)) {
    return true;
  }
  if (ParseMaterialLib(status)) {
    return true;
  }
  if (ParseObject(status)) {
    return true;
  }
  // No known definition was found. Ignore the line.
  parser::SkipLine(buffer());
  return true;
}